

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pset_io.c
# Opt level: O2

pset_t * read_pset_file(char *file_name,acmod_set_t *acmod_set,uint32 *n_pset)

{
  pset_t *ppVar1;
  uint32 uVar2;
  int32 iVar3;
  uint uVar4;
  acmod_id_t aVar5;
  int iVar6;
  FILE *__stream;
  lineiter_t *plVar7;
  pset_t *ppVar8;
  acmod_id_t *paVar9;
  uint32 *puVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  
  __stream = fopen(file_name,"r");
  if (__stream == (FILE *)0x0) {
    ppVar8 = (pset_t *)0x0;
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                   ,0x4a,"Unable to open %s",file_name);
  }
  else {
    plVar7 = lineiter_start((FILE *)__stream);
    uVar12 = 0;
    while (plVar7 != (lineiter_t *)0x0) {
      plVar7 = lineiter_next(plVar7);
      uVar12 = uVar12 + 1;
    }
    ppVar8 = (pset_t *)
             __ckd_calloc__((ulong)uVar12,0x28,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                            ,0x50);
    *n_pset = uVar12;
    fseek(__stream,0,0);
    uVar2 = acmod_set_n_ci(acmod_set);
    plVar7 = lineiter_start((FILE *)__stream);
    uVar12 = 0;
    while (plVar7 != (lineiter_t *)0x0) {
      iVar3 = str2words(plVar7->buf,(char **)0x0,0);
      ppVar1 = ppVar8 + uVar12;
      uVar4 = iVar3 - 1;
      ppVar8[uVar12].n_phone = uVar4;
      if (uVar4 == 0) {
        string_trim(plVar7->buf,STRING_BOTH);
        pcVar11 = strdup(plVar7->buf);
        ppVar1->name = pcVar11;
        puVar10 = (uint32 *)
                  __ckd_calloc__(4,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                                 ,0x6f);
        ppVar1->posn = puVar10;
        pcVar11 = ppVar1->name;
        iVar6 = strcmp(pcVar11,"WDBNDRY_B");
        if (iVar6 != 0) {
          iVar6 = strcmp(pcVar11,"WDBNDRY_E");
          if (iVar6 == 0) {
            puVar10 = puVar10 + 1;
          }
          else {
            iVar6 = strcmp(pcVar11,"WDBNDRY_S");
            if (iVar6 == 0) {
              puVar10 = puVar10 + 2;
            }
            else {
              iVar6 = strcmp(pcVar11,"WDBNDRY_I");
              if (iVar6 != 0) {
                err_msg(ERR_FATAL,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                        ,0x7e,"Unknown null question %s\n",pcVar11);
                exit(1);
              }
              puVar10 = puVar10 + 3;
            }
          }
        }
        *puVar10 = 1;
        ppVar1->phone = (acmod_id_t *)0x0;
      }
      else {
        paVar9 = (acmod_id_t *)
                 __ckd_calloc__((ulong)uVar4,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                                ,0x5e);
        ppVar1->phone = paVar9;
        puVar10 = (uint32 *)
                  __ckd_calloc__((ulong)uVar2,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                                 ,0x5f);
        ppVar1->member = puVar10;
        pcVar11 = strtok(plVar7->buf," \t");
        pcVar11 = strdup(pcVar11);
        ppVar1->name = pcVar11;
        for (uVar13 = 0; uVar4 != uVar13; uVar13 = uVar13 + 1) {
          pcVar11 = strtok((char *)0x0," \t");
          aVar5 = acmod_set_name2id(acmod_set,pcVar11);
          if (aVar5 == 0xffffffff) {
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/pset_io.c"
                    ,0x65,"Unknown phone %s in set %s\n",pcVar11,ppVar1->name);
          }
          else {
            ppVar1->phone[uVar13] = aVar5;
            ppVar1->member[aVar5] = 1;
          }
        }
      }
      plVar7 = lineiter_next(plVar7);
      uVar12 = uVar12 + 1;
    }
  }
  return ppVar8;
}

Assistant:

pset_t *
read_pset_file(const char *file_name,
	       acmod_set_t *acmod_set,
	       uint32 *n_pset)
{
    FILE *fp;
    lineiter_t *li;
    uint32 i, j, lc, n_phone, p;
    pset_t *out;
    uint32 n_ci;

    fp = fopen(file_name, "r");

    if (fp == NULL) {
	E_ERROR_SYSTEM("Unable to open %s", file_name);
	return NULL;
    }

    for (lc = 0, li = lineiter_start(fp); li; li = lineiter_next(li), lc++);

    out = ckd_calloc(lc, sizeof(pset_t));
    *n_pset = lc;

    fseek(fp, 0L, SEEK_SET);

    n_ci = acmod_set_n_ci(acmod_set);

    for (i = 0, li = lineiter_start(fp); li; li = lineiter_next(li), i++) {

	n_phone = str2words(li->buf, NULL, 0) - 1;

	out[i].n_phone = n_phone;

	if (n_phone > 0) {
	    out[i].phone  = ckd_calloc(n_phone, sizeof(acmod_id_t));
	    out[i].member = ckd_calloc(n_ci, sizeof(uint32));
	    out[i].name = strdup(strtok(li->buf, " \t"));
	    for (j = 0; j < n_phone; j++) {
		char *phone = strtok(NULL, " \t");
		p = acmod_set_name2id(acmod_set, phone);
		if (p == NO_ACMOD) {
		    E_WARN("Unknown phone %s in set %s\n", phone, out[i].name);
		    continue;
		}
		out[i].phone[j] = (acmod_id_t)p;
		out[i].member[p] = TRUE;
	    }
	}
	else {
	    string_trim(li->buf, STRING_BOTH);
	    out[i].name = strdup(li->buf);
	    out[i].posn = ckd_calloc(N_WORD_POSN, sizeof(uint32));

	    if (strcmp(out[i].name, "WDBNDRY_B") == 0) {
		out[i].posn[(int)WORD_POSN_BEGIN] = TRUE;
	    }
	    else if (strcmp(out[i].name, "WDBNDRY_E") == 0) {
		out[i].posn[(int)WORD_POSN_END] = TRUE;
	    }
	    else if (strcmp(out[i].name, "WDBNDRY_S") == 0) {
		out[i].posn[(int)WORD_POSN_SINGLE] = TRUE;
	    }
	    else if (strcmp(out[i].name, "WDBNDRY_I") == 0) {
		out[i].posn[(int)WORD_POSN_INTERNAL] = TRUE;
	    }
	    else {
		E_FATAL("Unknown null question %s\n", out[i].name);
	    }

	    out[i].phone = NULL;
	}
    }

    return out;
}